

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O3

bool tinyusdz::prim::ReconstructShader<tinyusdz::UsdPrimvarReader<int>>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,
               UsdPrimvarReader_int *preader,string *warn,string *err,
               PrimReconstructOptions *options)

{
  long *plVar1;
  undefined1 uVar2;
  anon_struct_8_0_00000001_for___align aVar3;
  size_type sVar4;
  bool bVar5;
  undefined1 uVar6;
  int iVar7;
  uint32_t uVar8;
  ostream *poVar9;
  undefined8 *puVar10;
  const_iterator cVar11;
  optional<tinyusdz::Interpolation> *poVar12;
  long *plVar13;
  mapped_type *pmVar14;
  _Base_ptr p_Var15;
  optional<tinyusdz::Interpolation> oVar16;
  undefined8 uVar17;
  anon_struct_8_0_00000001_for___align __n;
  anon_struct_8_0_00000001_for___align __n_00;
  undefined8 uVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__v;
  _Base_ptr p_Var19;
  ParseResult ret;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  ostringstream ss_e_1;
  stringstream ss;
  optional<tinyusdz::Interpolation> in_stack_fffffffffffffa38;
  bool local_5c0;
  undefined3 uStack_5bf;
  storage_t<tinyusdz::Interpolation> sStack_5bc;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined1 local_5a0 [8];
  undefined1 local_598 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_588;
  undefined1 local_578 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_568 [2];
  undefined8 local_548;
  AttrMetas *local_540;
  storage_t<double> local_538;
  anon_struct_8_0_00000001_for___align local_530;
  storage_t<tinyusdz::Token> local_528;
  undefined1 local_508 [16];
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  local_4f8 [8];
  undefined1 local_4f0 [32];
  undefined1 local_4d0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  undefined1 local_4a8 [12];
  storage_t<unsigned_int> sStack_49c;
  undefined1 local_498 [16];
  storage_t<tinyusdz::value::StringData> local_488;
  ios_base local_438 [264];
  storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_330;
  _Alloc_hider local_310;
  undefined1 local_308 [24];
  string local_2f0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0;
  string local_2d0;
  undefined1 local_2b0 [12];
  storage_t<unsigned_int> sStack_2a4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0;
  undefined1 local_290 [24];
  undefined1 auStack_278 [32];
  undefined1 local_258 [40];
  ios_base aiStack_230 [8];
  bool local_228;
  storage_t<double> local_220;
  bool local_218;
  undefined1 local_210 [40];
  storage_t<tinyusdz::Token> local_1e8;
  undefined1 local_1c8 [48];
  undefined1 local_198 [56];
  undefined1 local_160 [40];
  undefined1 local_138 [40];
  undefined1 local_110 [40];
  undefined1 local_e8 [16];
  anon_struct_8_0_00000001_for___align local_d8;
  storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  pointer pSStack_b0;
  undefined1 local_a8 [25];
  undefined8 uStack_8f;
  undefined1 local_80 [80];
  
  local_4f0._16_8_ = local_4f0;
  local_4f0._0_4_ = 0;
  local_4f0._8_8_ = (_Link_type)0x0;
  local_4d0 = (undefined1  [8])0x0;
  local_5a8 = err;
  local_548 = preader;
  local_508._0_8_ = warn;
  local_4f0._24_8_ = local_4f0._16_8_;
  local_2b0._0_8_ = &local_2a0;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"info:id","");
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            (local_4f8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._0_8_ != &local_2a0) {
    operator_delete((void *)local_2b0._0_8_,(ulong)(local_2a0._M_allocated_capacity + 1));
  }
  p_Var15 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var19 = &(properties->_M_t)._M_impl.super__Rb_tree_header._M_header;
  if (p_Var15 != p_Var19) {
    local_540 = (AttrMetas *)(local_548 + 0x730);
    local_330._24_8_ = local_548 + 0x940;
    local_330._8_8_ = local_548 + 0x958;
    local_528._24_8_ = local_548 + 0x990;
    local_528._16_8_ = local_548 + 0xc10;
    local_330.data._0_8_ = (undefined8)(local_548 + 0xe20);
    local_330._16_8_ = local_548 + 0x6d0;
    local_508._8_8_ = p_Var19;
    do {
      local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)(local_4d0 + 8),*(long *)(p_Var15 + 1),
                 (long)&(p_Var15[1]._M_parent)->_M_color + *(long *)(p_Var15 + 1));
      local_568[1]._8_8_ = p_Var15 + 2;
      local_578._0_8_ = local_568;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_578,"inputs:fallback","");
      sVar4 = local_4c8._M_string_length;
      uVar18 = local_578._8_8_;
      local_598._0_8_ = &aStack_588;
      local_598._8_8_ = (char *)0x0;
      aStack_588._M_allocated_capacity = aStack_588._M_allocated_capacity & 0xffffffffffffff00;
      __n = (anon_struct_8_0_00000001_for___align)local_4c8._M_string_length;
      if ((ulong)local_578._8_8_ < local_4c8._M_string_length) {
        __n = (anon_struct_8_0_00000001_for___align)local_578._8_8_;
      }
      if (__n == (anon_struct_8_0_00000001_for___align)0x0) {
        if (local_4c8._M_string_length == local_578._8_8_) goto LAB_00230ab5;
LAB_00230de3:
        local_5a0._0_4_ = 1;
      }
      else {
        iVar7 = bcmp(local_4c8._M_dataplus._M_p,(void *)local_578._0_8_,(size_t)__n);
        if ((sVar4 != uVar18) || (iVar7 != 0)) goto LAB_00230de3;
LAB_00230ab5:
        if (((ulong)p_Var15[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
          local_5a0._0_4_ = 7;
          in_stack_fffffffffffffa38.has_value_ = true;
          in_stack_fffffffffffffa38._1_3_ = 0;
          in_stack_fffffffffffffa38.contained = (storage_t<tinyusdz::Interpolation>)0x0;
          local_4a8._0_8_ = (optional<tinyusdz::Interpolation> *)local_498;
          local_4a8._0_8_ =
               ::std::__cxx11::string::_M_create((ulong *)local_4a8,(ulong)&stack0xfffffffffffffa38)
          ;
          *(undefined8 *)local_4a8._0_8_ = 0x79747265706f7250;
          *(undefined8 *)(local_4a8._0_8_ + 8) = 0x756d20607d7b6020;
          *(undefined8 *)(local_4a8._0_8_ + 0x10) = 0x7441206562207473;
          *(undefined8 *)(local_4a8._0_8_ + 0x18) = 0x2c65747562697274;
          *(undefined8 *)(local_4a8._0_8_ + 0x20) = 0x6365642074756220;
          *(undefined8 *)(local_4a8._0_8_ + 0x28) = 0x736120646572616c;
          builtin_strncpy((char *)((long)&((optional<tinyusdz::Interpolation> *)
                                          (local_4a8._0_8_ + 0x28))->contained + 2),"as Relat",8);
          builtin_strncpy((char *)((long)&((optional<tinyusdz::Interpolation> *)
                                          (local_4a8._0_8_ + 0x30))->contained + 2),"ionship.",8);
          (&((optional<tinyusdz::Interpolation> *)local_4a8._0_8_)->has_value_)
          [(long)in_stack_fffffffffffffa38] = false;
          unique0x10002eb0 = in_stack_fffffffffffffa38;
          local_498._0_8_ = in_stack_fffffffffffffa38;
          fmt::format<std::__cxx11::string>
                    ((string *)local_2b0,(fmt *)local_4a8,(string *)local_578,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffa38);
          ::std::__cxx11::string::operator=((string *)local_598,(string *)local_2b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b0._0_8_ != &local_2a0) {
            operator_delete((void *)local_2b0._0_8_,(ulong)(local_2a0._M_allocated_capacity + 1));
          }
          if ((optional<tinyusdz::Interpolation> *)local_4a8._0_8_ !=
              (optional<tinyusdz::Interpolation> *)local_498) {
            operator_delete((void *)local_4a8._0_8_,(ulong)(local_498._0_8_ + 1));
          }
        }
        if (p_Var15[6]._M_left != p_Var15[6]._M_parent) {
          std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                    ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_330._24_8_,
                     (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                     &p_Var15[6]._M_parent);
          local_5a0 = (undefined1  [8])((ulong)local_5a0 & 0xffffffff00000000);
        }
        Attribute::type_name_abi_cxx11_
                  ((string *)&stack0xfffffffffffffa38,(Attribute *)local_568[1]._8_8_);
        local_2b0._0_8_ = &local_2a0;
        local_2b0[8] = true;
        local_2b0._9_3_ = 0;
        sStack_2a4 = (storage_t<unsigned_int>)0x0;
        local_2a0._M_allocated_capacity._0_4_ = 0x746e69;
        if (_local_5c0 == (optional<tinyusdz::Interpolation>)0x3) {
          if (*(char *)((long)in_stack_fffffffffffffa38 + 2) != 't' ||
              *(short *)in_stack_fffffffffffffa38 != 0x6e69) {
            stack0xfffffffffffffb60 = (optional<tinyusdz::Interpolation>)0x3;
            local_498._0_4_ = 0x746e69;
            local_4a8._0_8_ = (optional<tinyusdz::Interpolation> *)local_498;
            if (*(char *)((long)in_stack_fffffffffffffa38 + 2) != 't' ||
                *(short *)in_stack_fffffffffffffa38 != 0x6e69) goto LAB_00230c7a;
          }
          iVar7 = *(int *)((long)&p_Var15[0x17]._M_parent + 4);
          if (iVar7 == 1) {
            if (p_Var15[5]._M_left == p_Var15[5]._M_parent) {
              if (p_Var15[4]._M_right == (_Base_ptr)0x0) {
                bVar5 = false;
              }
              else {
                iVar7 = (**(code **)p_Var15[4]._M_right)();
                bVar5 = iVar7 == 4;
              }
              uVar6 = (undefined1)p_Var15[5]._M_color;
              if ((bVar5) || ((uVar6 & _S_black) != _S_red)) {
                *(bool *)(local_548 + 0x988) = true;
              }
            }
            else {
              uVar6 = (undefined1)p_Var15[5]._M_color;
            }
            if (((((uVar6 & _S_black) == _S_red) && (p_Var15[4]._M_right != (_Base_ptr)0x0)) &&
                ((iVar7 = (**(code **)p_Var15[4]._M_right)(), iVar7 == 0 ||
                 ((p_Var15[4]._M_right != (_Base_ptr)0x0 &&
                  (iVar7 = (**(code **)p_Var15[4]._M_right)(), iVar7 == 1)))))) &&
               (p_Var15[5]._M_left == p_Var15[5]._M_parent)) {
              if (p_Var15[6]._M_left != p_Var15[6]._M_parent) {
                AttrMetas::operator=(local_540,(AttrMetas *)(p_Var15 + 7));
                __v = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_4d0 + 8);
                goto LAB_002318b3;
              }
            }
            else {
              anon_unknown_0::ConvertToAnimatable<int>
                        ((optional<tinyusdz::Animatable<int>_> *)local_4a8,
                         (PrimVar *)&p_Var15[4]._M_parent);
              uVar6 = local_4a8[0];
              local_2b0[0] = local_4a8[0];
              if (local_4a8[0] == 1) {
                sStack_2a4._0_2_ = sStack_49c._0_2_;
                local_2b0._8_4_ = local_4a8._8_4_;
                local_2a0._M_allocated_capacity = local_498._0_8_;
                local_2a0._8_8_ = local_498._8_8_;
                local_290._0_8_ = local_488.data.__align;
                local_290[8] = local_488._8_1_;
                nonstd::optional_lite::optional<tinyusdz::Animatable<int>>::operator=
                          ((optional<tinyusdz::Animatable<int>> *)local_330._8_8_,
                           (Animatable<int> *)(local_2b0 + 8));
                uVar2 = local_2b0[0];
              }
              else {
                local_5a0._0_4_ = 8;
                warn = (string *)0x55;
                ::std::__cxx11::string::_M_replace
                          ((ulong)local_598,0,(char *)local_598._8_8_,0x3df346);
                uVar2 = uVar6;
              }
              if (((uVar2 & 1) != 0) &&
                 ((optional<tinyusdz::Interpolation>)local_2a0._M_allocated_capacity !=
                  (optional<tinyusdz::Interpolation>)0x0)) {
                operator_delete((void *)local_2a0._M_allocated_capacity,
                                local_290._0_8_ - local_2a0._0_8_);
              }
              if (uVar6 != 0) goto LAB_00231892;
            }
          }
          else if (iVar7 == 0) {
            *(bool *)(local_548 + 0x938) = true;
LAB_00231892:
            AttrMetas::operator=(local_540,(AttrMetas *)(p_Var15 + 7));
            __v = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_578;
LAB_002318b3:
            ::std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>(local_4f8,__v);
            local_5a0 = (undefined1  [8])((ulong)local_5a0 & 0xffffffff00000000);
          }
          else {
            warn = (string *)0x25;
            ::std::__cxx11::string::_M_replace((ulong)local_598,0,(char *)local_598._8_8_,0x3df078);
            local_5a0._0_4_ = 8;
          }
        }
        else {
LAB_00230c7a:
          local_5a0._0_4_ = 3;
          ::std::__cxx11::stringstream::stringstream((stringstream *)local_2b0);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2a0._M_local_buf,"Property type mismatch. ",0x18);
          poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_2a0._M_local_buf,(char *)local_578._0_8_,
                              local_578._8_8_);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," expects type `",0xf);
          stack0xfffffffffffffb60 = (optional<tinyusdz::Interpolation>)0x3;
          local_498._0_4_ = 0x746e69;
          local_4a8._0_8_ = (optional<tinyusdz::Interpolation> *)local_498;
          poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)local_498,3);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,"` but defined as type `",0x17);
          poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                             (poVar9,(char *)in_stack_fffffffffffffa38,(long)_local_5c0);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"`",1);
          if ((optional<tinyusdz::Interpolation> *)local_4a8._0_8_ !=
              (optional<tinyusdz::Interpolation> *)local_498) {
            operator_delete((void *)local_4a8._0_8_,(ulong)(local_498._0_8_ + 1));
          }
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::operator=((string *)local_598,(string *)local_4a8);
          if ((optional<tinyusdz::Interpolation> *)local_4a8._0_8_ !=
              (optional<tinyusdz::Interpolation> *)local_498) {
            operator_delete((void *)local_4a8._0_8_,(ulong)(local_498._0_8_ + 1));
          }
          ::std::__cxx11::stringstream::~stringstream((stringstream *)local_2b0);
          ::std::ios_base::~ios_base(aiStack_230);
        }
        if (in_stack_fffffffffffffa38 != (optional<tinyusdz::Interpolation>)&stack0xfffffffffffffa48
           ) {
          operator_delete((void *)in_stack_fffffffffffffa38,local_5b8 + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_578._0_8_ != local_568) {
        operator_delete((void *)local_578._0_8_,
                        CONCAT44(local_568[0]._M_allocated_capacity._4_4_,
                                 CONCAT13(local_568[0]._M_local_buf[3],
                                          CONCAT12(local_568[0]._M_local_buf[2],
                                                   (undefined2)local_568[0]._M_allocated_capacity)))
                        + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
        operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
      }
      iVar7 = 0;
      if (((ulong)local_5a0 & 0xfffffffd) == 0) {
        iVar7 = 3;
LAB_00231099:
        bVar5 = false;
      }
      else {
        bVar5 = true;
        if (local_5a0._0_4_ != 1) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                     ,0x5a);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2b0,"ReconstructShader",0x11);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"():",3);
          poVar9 = (ostream *)
                   ::std::ostream::operator<<
                             ((TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)local_2b0,
                              0x101c);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          in_stack_fffffffffffffa38 = (optional<tinyusdz::Interpolation>)&stack0xfffffffffffffa48;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&stack0xfffffffffffffa38,"Parsing attribute `{}` failed. Error: {}",
                     "");
          fmt::format<char[16],std::__cxx11::string>
                    ((string *)local_4a8,(fmt *)&stack0xfffffffffffffa38,(string *)"inputs:fallback"
                     ,(char (*) [16])local_598,warn);
          poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_2b0,(char *)local_4a8._0_8_,stack0xfffffffffffffb60);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
          if ((optional<tinyusdz::Interpolation> *)local_4a8._0_8_ !=
              (optional<tinyusdz::Interpolation> *)local_498) {
            operator_delete((void *)local_4a8._0_8_,(ulong)(local_498._0_8_ + 1));
          }
          if (in_stack_fffffffffffffa38 !=
              (optional<tinyusdz::Interpolation>)&stack0xfffffffffffffa48) {
            operator_delete((void *)in_stack_fffffffffffffa38,local_5b8 + 1);
          }
          if ((anon_struct_8_0_00000001_for___align)local_5a8 !=
              (anon_struct_8_0_00000001_for___align)0x0) {
            ::std::__cxx11::stringbuf::str();
            puVar10 = (undefined8 *)
                      ::std::__cxx11::string::_M_append
                                (&stack0xfffffffffffffa38,*(ulong *)local_5a8);
            poVar12 = (optional<tinyusdz::Interpolation> *)(puVar10 + 2);
            if ((optional<tinyusdz::Interpolation> *)*puVar10 == poVar12) {
              local_498._0_8_ = *poVar12;
              local_498._8_8_ = puVar10[3];
              local_4a8._0_8_ = (optional<tinyusdz::Interpolation> *)local_498;
            }
            else {
              local_498._0_8_ = *poVar12;
              local_4a8._0_8_ = (optional<tinyusdz::Interpolation> *)*puVar10;
            }
            unique0x00012000 = *(optional<tinyusdz::Interpolation> *)(puVar10 + 1);
            *puVar10 = poVar12;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            ::std::__cxx11::string::operator=((string *)local_5a8,(string *)local_4a8);
            if ((optional<tinyusdz::Interpolation> *)local_4a8._0_8_ !=
                (optional<tinyusdz::Interpolation> *)local_498) {
              operator_delete((void *)local_4a8._0_8_,(ulong)(local_498._0_8_ + 1));
            }
            if (in_stack_fffffffffffffa38 !=
                (optional<tinyusdz::Interpolation>)&stack0xfffffffffffffa48) {
              operator_delete((void *)in_stack_fffffffffffffa38,local_5b8 + 1);
            }
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
          ::std::ios_base::~ios_base((ios_base *)(local_258 + 0x18));
          iVar7 = 1;
          goto LAB_00231099;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_598._0_8_ != &aStack_588) {
        operator_delete((void *)local_598._0_8_,aStack_588._M_allocated_capacity + 1);
      }
      if (bVar5) {
        uVar18 = p_Var15 + 1;
        iVar7 = ::std::__cxx11::string::compare((char *)uVar18);
        if (iVar7 == 0) {
          local_2b0._0_8_ = &local_2a0;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"inputs:varname","")
          ;
          cVar11 = ::std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_4f8,(key_type *)local_2b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b0._0_8_ != &local_2a0) {
            operator_delete((void *)local_2b0._0_8_,(ulong)(local_2a0._M_allocated_capacity + 1));
          }
          if (cVar11._M_node == (_Base_ptr)local_4f0) {
            local_2b0._0_8_ = ((ulong)local_2b0._0_8_ >> 8 & 0xffffff) << 8;
            stack0xfffffffffffffd58 =
                 (optional<unsigned_int>)(((ulong)stack0xfffffffffffffd58 >> 8 & 0xffffff) << 8);
            local_2a0._M_allocated_capacity = local_2a0._M_allocated_capacity & 0xffffffffffff0000;
            local_2a0._8_8_ = local_2a0._8_8_ & 0xffffffffffffff00;
            local_220 = (storage_t<double>)0x0;
            local_218 = false;
            local_110._16_8_ = 0;
            local_110._24_8_ = 0;
            local_110._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_110._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_e8._0_4_ = 0;
            local_e8._8_8_ = 0;
            auStack_278[0x18] = '\0';
            auStack_278._8_8_ = (pointer)0x0;
            auStack_278._16_8_ = 0;
            local_290._16_8_ = 0;
            auStack_278._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_290._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_290._8_8_ = 0;
            local_228 = false;
            local_258._32_8_ = (pointer)0x0;
            aiStack_230 = (ios_base  [8])0x0;
            local_258._16_8_ = 0;
            local_258._24_8_ = (pointer)0x0;
            local_258._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_258[8] = false;
            local_258._9_3_ = 0;
            local_258._12_4_ = (storage_t<tinyusdz::Path::PathType>)0x0;
            local_210[0x20] = 0;
            local_210._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_210._24_8_ = 0;
            local_210._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_210._8_8_ = 0;
            local_1c8[0] = 0;
            local_1e8._16_8_ = 0;
            local_1e8._24_8_ = 0;
            local_1e8.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
            local_1e8._8_8_ = 0;
            local_1c8[0x28] = 0;
            local_1c8._24_8_ = 0;
            local_1c8._32_8_ = 0;
            local_1c8._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_1c8._16_8_ = 0;
            local_198[0x30] = 0;
            local_198._32_8_ = 0;
            local_198._40_8_ = 0;
            local_198._16_8_ = 0;
            local_198._24_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_198._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_198._8_8_ = (storage_t<double>)0x0;
            local_160[0x20] = 0;
            local_160._16_8_ = 0;
            local_160._24_8_ = 0;
            local_160._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_160._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_138[0x20] = 0;
            local_138._16_8_ = 0;
            local_138._24_8_ = 0;
            local_138._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_138._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_d8 = (anon_struct_8_0_00000001_for___align)local_e8;
            local_a8[0] = 0;
            local_d0._24_8_ = 0;
            pSStack_b0 = (pointer)0x0;
            local_d0._8_8_ = 0;
            local_d0._16_8_ = 0;
            local_a8[0x18] = 0;
            uStack_8f = 0;
            local_a8._8_8_ = 0;
            local_a8[0x10] = 0;
            local_a8._17_7_ = 0;
            local_80[0x40] = 0;
            local_80._65_8_ = 0;
            local_80._48_8_ = (_Base_ptr)0x0;
            local_80[0x38] = 0;
            local_80._57_7_ = 0;
            local_80._32_8_ = 0;
            local_80._40_8_ = 0;
            local_80._16_8_ = 0;
            local_80._24_8_ = 0;
            local_80._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            local_80._8_8_ = 0;
            local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
            local_568[1]._0_8_ = uVar18;
            local_d0.data.__align = local_d8;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_2d0,*(long *)(p_Var15 + 1),
                       (long)&(p_Var15[1]._M_parent)->_M_color + *(long *)(p_Var15 + 1));
            warn = (string *)local_4a8;
            local_4a8._0_8_ = (optional<tinyusdz::Interpolation> *)local_498;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)warn,"inputs:varname","");
            err = (string *)local_2b0;
            anon_unknown_0::ParseTypedAttribute<tinyusdz::Token>
                      ((ParseResult *)local_5a0,
                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_4f8,&local_2d0,(Property *)local_568[1]._8_8_,warn,
                       (TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)local_2b0);
            if ((optional<tinyusdz::Interpolation> *)local_4a8._0_8_ !=
                (optional<tinyusdz::Interpolation> *)local_498) {
              operator_delete((void *)local_4a8._0_8_,(ulong)(local_498._0_8_ + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
              operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1
                             );
            }
            uVar18 = local_568[1]._0_8_;
            if (local_5a0._0_4_ == 3) {
              local_2f0._0_8_ = &local_2e0;
              ::std::__cxx11::string::_M_construct<char*>
                        (local_2f0,*(long *)(p_Var15 + 1),
                         (long)&(p_Var15[1]._M_parent)->_M_color + *(long *)(p_Var15 + 1));
              in_stack_fffffffffffffa38 =
                   (optional<tinyusdz::Interpolation>)&stack0xfffffffffffffa48;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&stack0xfffffffffffffa38,"inputs:varname","");
              uVar17 = local_568[1]._8_8_;
              warn = (string *)&stack0xfffffffffffffa38;
              err = (string *)local_528._24_8_;
              (anonymous_namespace)::ParseTypedAttribute<std::__cxx11::string>
                        ((ParseResult *)local_4a8,(_anonymous_namespace_ *)local_4f8,
                         (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_2f0,(string *)local_568[1]._8_8_,
                         (Property *)&stack0xfffffffffffffa38,(string *)local_528._24_8_,
                         (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_fffffffffffffa38);
              local_5a0._0_4_ = local_4a8._0_4_;
              ::std::__cxx11::string::operator=((string *)local_598,(string *)(local_4a8 + 8));
              if (stack0xfffffffffffffb60 != (long)local_498 + 8) {
                operator_delete((void *)stack0xfffffffffffffb60,local_498._8_8_ + 1);
              }
              if (in_stack_fffffffffffffa38 !=
                  (optional<tinyusdz::Interpolation>)&stack0xfffffffffffffa48) {
                operator_delete((void *)in_stack_fffffffffffffa38,local_5b8 + 1);
              }
              uVar18 = local_568[1]._0_8_;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2f0._0_8_ != &local_2e0) {
                operator_delete((void *)local_2f0._0_8_,local_2e0._M_allocated_capacity + 1);
              }
              if (local_5a0._0_4_ != 0) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4a8);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4a8,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4a8,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4a8,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4a8,"ReconstructShader",0x11);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4a8,"():",3);
                poVar9 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4a8,0x102c);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
                local_578._0_8_ = local_568;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_578,"Faied to parse inputs:varname: {}","");
                fmt::format<std::__cxx11::string>
                          ((string *)&stack0xfffffffffffffa38,(fmt *)local_578,(string *)local_598,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           uVar17);
                poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_4a8,(char *)in_stack_fffffffffffffa38,
                                    (long)_local_5c0);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
                if (in_stack_fffffffffffffa38 !=
                    (optional<tinyusdz::Interpolation>)&stack0xfffffffffffffa48) {
                  operator_delete((void *)in_stack_fffffffffffffa38,local_5b8 + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_578._0_8_ != local_568) {
                  operator_delete((void *)local_578._0_8_,
                                  CONCAT44(local_568[0]._M_allocated_capacity._4_4_,
                                           CONCAT13(local_568[0]._M_local_buf[3],
                                                    CONCAT12(local_568[0]._M_local_buf[2],
                                                             (undefined2)
                                                             local_568[0]._M_allocated_capacity))) +
                                  1);
                }
                goto LAB_002316cf;
              }
LAB_00231741:
              iVar7 = 3;
LAB_0023194a:
              bVar5 = false;
            }
            else {
              if (local_5a0._0_4_ == 0) {
                bVar5 = ConvertTokenAttributeToStringAttribute
                                  ((TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)
                                   local_2b0,
                                   (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)local_528._24_8_);
                if (bVar5) goto LAB_00231741;
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4a8);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4a8,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4a8,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4a8,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4a8,"ReconstructShader",0x11);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4a8,"():",3);
                poVar9 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4a8,0x1023);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4a8,
                           "Failed to convert inputs:varname token type to string type.",0x3b);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4a8,"\n",1);
LAB_002316cf:
                if ((anon_struct_8_0_00000001_for___align)local_5a8 !=
                    (anon_struct_8_0_00000001_for___align)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  poVar12 = (optional<tinyusdz::Interpolation> *)
                            ::std::__cxx11::string::_M_append(local_578,*(ulong *)local_5a8);
                  oVar16 = (optional<tinyusdz::Interpolation>)(poVar12 + 2);
                  if (*poVar12 == oVar16) {
                    local_5b8 = *(undefined8 *)oVar16;
                    uStack_5b0 = poVar12[3];
                    in_stack_fffffffffffffa38 =
                         (optional<tinyusdz::Interpolation>)&stack0xfffffffffffffa48;
                  }
                  else {
                    local_5b8 = *(undefined8 *)oVar16;
                    in_stack_fffffffffffffa38 = *poVar12;
                  }
                  _local_5c0 = poVar12[1];
                  *poVar12 = oVar16;
                  poVar12[1].has_value_ = false;
                  *(undefined3 *)&poVar12[1].field_0x1 = 0;
                  poVar12[1].contained = (storage_t<tinyusdz::Interpolation>)0x0;
                  poVar12[2].has_value_ = false;
                  ::std::__cxx11::string::operator=
                            ((string *)local_5a8,(string *)&stack0xfffffffffffffa38);
                  if (in_stack_fffffffffffffa38 !=
                      (optional<tinyusdz::Interpolation>)&stack0xfffffffffffffa48) {
                    operator_delete((void *)in_stack_fffffffffffffa38,local_5b8 + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_578._0_8_ != local_568) {
                    operator_delete((void *)local_578._0_8_,
                                    CONCAT44(local_568[0]._M_allocated_capacity._4_4_,
                                             CONCAT13(local_568[0]._M_local_buf[3],
                                                      CONCAT12(local_568[0]._M_local_buf[2],
                                                               (undefined2)
                                                               local_568[0]._M_allocated_capacity)))
                                    + 1);
                  }
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4a8);
                ::std::ios_base::~ios_base(local_438);
                iVar7 = 1;
                goto LAB_0023194a;
              }
              iVar7 = 0;
              bVar5 = true;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_598._0_8_ != &aStack_588) {
              operator_delete((void *)local_598._0_8_,aStack_588._M_allocated_capacity + 1);
            }
            if (uStack_8f._7_1_ == true) {
              nonstd::optional_lite::detail::storage_t<tinyusdz::Animatable<tinyusdz::Token>_>::
              destruct_value((storage_t<tinyusdz::Animatable<tinyusdz::Token>_> *)local_80);
            }
            ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                      ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)(local_a8 + 8));
            AttrMetas::~AttrMetas((AttrMetas *)local_2b0);
            p_Var19 = (_Base_ptr)local_508._8_8_;
            if (!bVar5) goto LAB_002320ba;
          }
        }
        local_310._M_p = local_308 + 8;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_310,*(long *)(p_Var15 + 1),
                   (long)&(p_Var15[1]._M_parent)->_M_color + *(long *)(p_Var15 + 1));
        local_538 = (storage_t<double>)&local_528;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_538,"outputs:result","");
        uVar17 = local_308._0_8_;
        aVar3 = local_530;
        unique0x00005300 = (long)local_498 + 8;
        local_498[0] = false;
        local_498._1_3_ = 0;
        local_498._4_4_ = (storage_t<tinyusdz::Interpolation>)0x0;
        local_498._8_8_ = local_498._8_8_ & 0xffffffffffffff00;
        __n_00 = (anon_struct_8_0_00000001_for___align)local_308._0_8_;
        if ((ulong)local_530 < (ulong)local_308._0_8_) {
          __n_00 = local_530;
        }
        if (__n_00 == (anon_struct_8_0_00000001_for___align)0x0) {
          if ((anon_struct_8_0_00000001_for___align)local_308._0_8_ == local_530) goto LAB_00231a5a;
LAB_00231a94:
          local_4a8._0_4_ = 1;
        }
        else {
          iVar7 = bcmp(local_310._M_p,(void *)local_538,(size_t)__n_00);
          if (((anon_struct_8_0_00000001_for___align)uVar17 != aVar3) || (iVar7 != 0))
          goto LAB_00231a94;
LAB_00231a5a:
          cVar11 = ::std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_4f8,(key_type *)&local_538);
          if (cVar11._M_node == (_Base_ptr)local_4f0) {
            if (*(uint *)((long)&p_Var15[0x17]._M_parent + 4) < 2) {
              bVar5 = Attribute::is_connection((Attribute *)local_568[1]._8_8_);
              if (bVar5) {
                local_4a8._0_4_ = 5;
                warn = (string *)0x38;
                ::std::__cxx11::string::_M_replace
                          ((ulong)(local_4a8 + 8),0,(char *)local_498._0_8_,0x3e1315);
              }
              else {
                if (*(int *)((long)&p_Var15[0x17]._M_parent + 4) != 0) goto LAB_00231afb;
                Attribute::type_name_abi_cxx11_((string *)local_2b0,(Attribute *)local_568[1]._8_8_)
                ;
                bVar5 = tinyusdz::value::IsRoleType((string *)local_2b0);
                local_5a0 = (undefined1  [8])(local_598 + 8);
                local_598._0_8_ = (anon_struct_8_0_00000001_for___align)0x3;
                local_598._8_4_ = 0x746e69;
                if ((stack0xfffffffffffffd58 == (optional<unsigned_int>)0x3) &&
                   (*(char *)(local_2b0._0_8_ + 2) == 't' && *(short *)local_2b0._0_8_ == 0x6e69)) {
                  *(bool *)(local_548 + 0xe18) = true;
LAB_00232229:
                  AttrMetas::operator=
                            ((AttrMetas *)local_528.data._16_8_,(AttrMetas *)(p_Var15 + 7));
                  ::std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string_const&>
                            (local_4f8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_538);
                  local_4a8._0_8_ = local_4a8._0_8_ & 0xffffffff00000000;
                }
                else if (bVar5) {
                  uVar8 = tinyusdz::value::GetUnderlyingTypeId((string *)local_2b0);
                  if (uVar8 == 0xf) {
                    *(bool *)(local_548 + 0xe18) = true;
                    ::std::__cxx11::string::_M_assign((string *)local_330.data._0_8_);
                    goto LAB_00232229;
                  }
                  local_4a8._0_4_ = 3;
                  local_578[0] = true;
                  local_578._1_3_ = 0;
                  local_578._4_4_ = (storage_t<tinyusdz::Interpolation>)0x0;
                  local_568[1]._0_8_ = uVar18;
                  oVar16 = (optional<tinyusdz::Interpolation>)
                           ::std::__cxx11::string::_M_create
                                     ((ulong *)&stack0xfffffffffffffa38,(ulong)local_578);
                  uVar18 = local_578._0_8_;
                  local_5b8 = local_578._0_8_;
                  in_stack_fffffffffffffa38 = oVar16;
                  memcpy((void *)oVar16,
                         "Attribute type mismatch. {} expects type `{}` but defined as type `{}`(and its underlying types)."
                         ,0x61);
                  local_578[0] = (undefined1)uVar18;
                  local_578._1_3_ = SUB83(uVar18,1);
                  local_578._4_4_ = SUB84(uVar18,4);
                  local_5c0 = (bool)local_578[0];
                  uStack_5bf = local_578._1_3_;
                  sStack_5bc = (storage_t<tinyusdz::Interpolation>)local_578._4_4_;
                  *(undefined1 *)((long)oVar16 + uVar18) = 0;
                  local_578._0_8_ = local_568;
                  local_568[0]._M_local_buf[2] = 't';
                  local_568[0]._M_allocated_capacity._0_2_ = 0x6e69;
                  local_578._8_8_ = (anon_struct_8_0_00000001_for___align)0x3;
                  local_568[0]._M_local_buf[3] = '\0';
                  warn = (string *)local_2b0;
                  fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                            ((string *)local_5a0,(fmt *)&stack0xfffffffffffffa38,
                             (string *)&local_538,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_578,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_2b0,err);
                  ::std::__cxx11::string::operator=((string *)(local_4a8 + 8),(string *)local_5a0);
                  if (local_5a0 != (undefined1  [8])(local_598 + 8)) {
                    operator_delete((void *)local_5a0,(ulong)(local_598._8_8_ + 1));
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_578._0_8_ != local_568) {
                    operator_delete((void *)local_578._0_8_,
                                    CONCAT44(local_568[0]._M_allocated_capacity._4_4_,
                                             CONCAT13(local_568[0]._M_local_buf[3],
                                                      CONCAT12(local_568[0]._M_local_buf[2],
                                                               (undefined2)
                                                               local_568[0]._M_allocated_capacity)))
                                    + 1);
                  }
                  uVar18 = local_568[1]._0_8_;
                  if (in_stack_fffffffffffffa38 !=
                      (optional<tinyusdz::Interpolation>)&stack0xfffffffffffffa48)
                  goto LAB_002323a2;
                }
                else {
                  local_4a8._0_4_ = 3;
                  local_578[0] = true;
                  local_578._1_3_ = 0;
                  local_578._4_4_ = (storage_t<tinyusdz::Interpolation>)0x0;
                  local_568[1]._0_8_ = uVar18;
                  oVar16 = (optional<tinyusdz::Interpolation>)
                           ::std::__cxx11::string::_M_create
                                     ((ulong *)&stack0xfffffffffffffa38,(ulong)local_578);
                  uVar18 = local_578._0_8_;
                  local_5b8 = local_578._0_8_;
                  in_stack_fffffffffffffa38 = oVar16;
                  memcpy((void *)oVar16,
                         "Property type mismatch. {} expects type `{}` but defined as type `{}`.",
                         0x46);
                  local_578[0] = (undefined1)uVar18;
                  local_578._1_3_ = SUB83(uVar18,1);
                  local_578._4_4_ = SUB84(uVar18,4);
                  local_5c0 = (bool)local_578[0];
                  uStack_5bf = local_578._1_3_;
                  sStack_5bc = (storage_t<tinyusdz::Interpolation>)local_578._4_4_;
                  *(undefined1 *)((long)oVar16 + uVar18) = 0;
                  local_578._0_8_ = local_568;
                  local_568[0]._M_local_buf[2] = 't';
                  local_568[0]._M_allocated_capacity._0_2_ = 0x6e69;
                  local_578._8_8_ = (anon_struct_8_0_00000001_for___align)0x3;
                  local_568[0]._M_local_buf[3] = '\0';
                  warn = (string *)local_2b0;
                  fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                            ((string *)local_5a0,(fmt *)&stack0xfffffffffffffa38,
                             (string *)&local_538,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_578,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_2b0,err);
                  ::std::__cxx11::string::operator=((string *)(local_4a8 + 8),(string *)local_5a0);
                  if (local_5a0 != (undefined1  [8])(local_598 + 8)) {
                    operator_delete((void *)local_5a0,(ulong)(local_598._8_8_ + 1));
                  }
                  uVar18 = local_568[1]._0_8_;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_578._0_8_ != local_568) {
                    operator_delete((void *)local_578._0_8_,
                                    CONCAT44(local_568[0]._M_allocated_capacity._4_4_,
                                             CONCAT13(local_568[0]._M_local_buf[3],
                                                      CONCAT12(local_568[0]._M_local_buf[2],
                                                               (undefined2)
                                                               local_568[0]._M_allocated_capacity)))
                                    + 1);
                  }
                  if (in_stack_fffffffffffffa38 !=
                      (optional<tinyusdz::Interpolation>)&stack0xfffffffffffffa48) {
LAB_002323a2:
                    operator_delete((void *)in_stack_fffffffffffffa38,local_5b8 + 1);
                  }
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2b0._0_8_ != &local_2a0) {
                  operator_delete((void *)local_2b0._0_8_,
                                  (ulong)(local_2a0._M_allocated_capacity + 1));
                }
              }
            }
            else {
LAB_00231afb:
              warn = (string *)&DAT_00000041;
              ::std::__cxx11::string::_M_replace
                        ((ulong)(local_4a8 + 8),0,(char *)local_498._0_8_,0x3e134e);
              local_4a8._0_4_ = 6;
            }
          }
          else {
            local_4a8._0_4_ = 2;
          }
        }
        if (local_538 != (storage_t<double>)&local_528) {
          operator_delete((void *)local_538,(long)local_528.data._0_8_ + 1);
        }
        if (local_310._M_p != local_308 + 8) {
          operator_delete(local_310._M_p,local_308._8_8_ + 1);
        }
        iVar7 = 0;
        if ((local_4a8._0_8_ & 0xfffffffd) == 0) {
          iVar7 = 3;
LAB_00231daa:
          bVar5 = false;
        }
        else {
          bVar5 = true;
          if (local_4a8._0_4_ != 1) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2b0,"ReconstructShader",0x11);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"():",3);
            poVar9 = (ostream *)
                     ::std::ostream::operator<<
                               ((TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)local_2b0,
                                0x1031);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
            in_stack_fffffffffffffa38 = (optional<tinyusdz::Interpolation>)&stack0xfffffffffffffa48;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&stack0xfffffffffffffa38,
                       "Parsing shader output property `{}` failed. Error: {}","");
            fmt::format<char[15],std::__cxx11::string>
                      ((string *)local_5a0,(fmt *)&stack0xfffffffffffffa38,
                       (string *)"outputs:result",(char (*) [15])(local_4a8 + 8),warn);
            poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_2b0,(char *)local_5a0,local_598._0_8_);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
            if (local_5a0 != (undefined1  [8])(local_598 + 8)) {
              operator_delete((void *)local_5a0,(ulong)(local_598._8_8_ + 1));
            }
            if (in_stack_fffffffffffffa38 !=
                (optional<tinyusdz::Interpolation>)&stack0xfffffffffffffa48) {
              operator_delete((void *)in_stack_fffffffffffffa38,local_5b8 + 1);
            }
            if ((anon_struct_8_0_00000001_for___align)local_5a8 !=
                (anon_struct_8_0_00000001_for___align)0x0) {
              ::std::__cxx11::stringbuf::str();
              plVar13 = (long *)::std::__cxx11::string::_M_append
                                          (&stack0xfffffffffffffa38,*(ulong *)local_5a8);
              plVar1 = plVar13 + 2;
              if ((long *)*plVar13 == plVar1) {
                local_598._8_8_ = *plVar1;
                aStack_588._M_allocated_capacity = plVar13[3];
                local_5a0 = (undefined1  [8])(local_598 + 8);
              }
              else {
                local_598._8_8_ = *plVar1;
                local_5a0 = (undefined1  [8])*plVar13;
              }
              local_598._0_8_ = *(anon_struct_8_0_00000001_for___align *)(plVar13 + 1);
              *plVar13 = (long)plVar1;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)local_5a8,(string *)local_5a0);
              if (local_5a0 != (undefined1  [8])(local_598 + 8)) {
                operator_delete((void *)local_5a0,(ulong)(local_598._8_8_ + 1));
              }
              if (in_stack_fffffffffffffa38 !=
                  (optional<tinyusdz::Interpolation>)&stack0xfffffffffffffa48) {
                operator_delete((void *)in_stack_fffffffffffffa38,local_5b8 + 1);
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
            ::std::ios_base::~ios_base((ios_base *)(local_258 + 0x18));
            iVar7 = 1;
            goto LAB_00231daa;
          }
        }
        if (stack0xfffffffffffffb60 != (long)local_498 + 8) {
          operator_delete((void *)stack0xfffffffffffffb60,local_498._8_8_ + 1);
        }
        p_Var19 = (_Base_ptr)local_508._8_8_;
        if (!bVar5) goto LAB_002320ba;
        cVar11 = ::std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_4f8,(key_type *)uVar18);
        if (cVar11._M_node == (_Base_ptr)local_4f0) {
          pmVar14 = ::std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                                  *)local_330._16_8_,(key_type *)uVar18);
          ::std::__cxx11::string::_M_assign((string *)pmVar14);
          (pmVar14->_attrib)._varying_authored = (bool)p_Var15[3].field_0x4;
          (pmVar14->_attrib)._variability = p_Var15[3]._M_color;
          ::std::__cxx11::string::_M_assign((string *)&(pmVar14->_attrib)._type_name);
          linb::any::operator=((any *)&(pmVar14->_attrib)._var,(any *)&p_Var15[4]._M_parent);
          (pmVar14->_attrib)._var._blocked = SUB41(p_Var15[5]._M_color,0);
          ::std::
          vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ::operator=(&(pmVar14->_attrib)._var._ts._samples,
                      (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                       *)&p_Var15[5]._M_parent);
          (pmVar14->_attrib)._var._ts._dirty = SUB41(p_Var15[6]._M_color,0);
          std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                    ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                     &(pmVar14->_attrib)._paths,
                     (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                     &p_Var15[6]._M_parent);
          AttrMetas::operator=(&(pmVar14->_attrib)._metas,(AttrMetas *)(p_Var15 + 7));
          *(_Base_ptr *)&pmVar14->_listOpQual = p_Var15[0x17]._M_parent;
          (pmVar14->_rel).type = *(Type *)&p_Var15[0x17]._M_left;
          Path::operator=(&(pmVar14->_rel).targetPath,(Path *)&p_Var15[0x17]._M_right);
          std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                    ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                     &(pmVar14->_rel).targetPathVector,
                     (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                     &p_Var15[0x1e]._M_parent);
          (pmVar14->_rel).listOpQual = p_Var15[0x1f]._M_color;
          AttrMetas::operator=(&(pmVar14->_rel)._metas,(AttrMetas *)&p_Var15[0x1f]._M_parent);
          (pmVar14->_rel)._varying_authored = *(bool *)&p_Var15[0x2f]._M_left;
          ::std::__cxx11::string::_M_assign((string *)&pmVar14->_prop_value_type_name);
          pmVar14->_has_custom = *(bool *)&p_Var15[0x30]._M_right;
          ::std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    (local_4f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar18);
        }
        cVar11 = ::std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_4f8,(key_type *)uVar18);
        if (cVar11._M_node == (_Base_ptr)local_4f0) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"[warn]",6);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                     ,0x5a);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2b0,"ReconstructShader",0x11);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"():",3);
          poVar9 = (ostream *)
                   ::std::ostream::operator<<
                             ((TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)local_2b0,
                              0x1033);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_4a8,"Unsupported/unimplemented property: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           uVar18);
          poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_2b0,(char *)local_4a8._0_8_,stack0xfffffffffffffb60);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
          if ((optional<tinyusdz::Interpolation> *)local_4a8._0_8_ !=
              (optional<tinyusdz::Interpolation> *)local_498) {
            operator_delete((void *)local_4a8._0_8_,(ulong)(local_498._0_8_ + 1));
          }
          if ((anon_struct_8_0_00000001_for___align)local_508._0_8_ !=
              (anon_struct_8_0_00000001_for___align)0x0) {
            ::std::__cxx11::stringbuf::str();
            puVar10 = (undefined8 *)::std::__cxx11::string::_M_append(local_5a0,*(ulong *)local_5a8)
            ;
            poVar12 = (optional<tinyusdz::Interpolation> *)(puVar10 + 2);
            if ((optional<tinyusdz::Interpolation> *)*puVar10 == poVar12) {
              local_498._0_8_ = *poVar12;
              local_498._8_8_ = puVar10[3];
              local_4a8._0_8_ = (optional<tinyusdz::Interpolation> *)local_498;
            }
            else {
              local_498._0_8_ = *poVar12;
              local_4a8._0_8_ = (optional<tinyusdz::Interpolation> *)*puVar10;
            }
            unique0x00012000 = *(optional<tinyusdz::Interpolation> *)(puVar10 + 1);
            *puVar10 = poVar12;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            ::std::__cxx11::string::operator=((string *)local_508._0_8_,(string *)local_4a8);
            if ((optional<tinyusdz::Interpolation> *)local_4a8._0_8_ !=
                (optional<tinyusdz::Interpolation> *)local_498) {
              operator_delete((void *)local_4a8._0_8_,(ulong)(local_498._0_8_ + 1));
            }
            if (local_5a0 != (undefined1  [8])(local_598 + 8)) {
              operator_delete((void *)local_5a0,(ulong)(local_598._8_8_ + 1));
            }
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
          ::std::ios_base::~ios_base((ios_base *)(local_258 + 0x18));
        }
      }
      else {
LAB_002320ba:
        if ((iVar7 != 3) && (iVar7 != 0)) break;
      }
      p_Var15 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var15);
    } while (p_Var15 != p_Var19);
  }
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_4f8,(_Link_type)local_4f0._8_8_);
  return false;
}

Assistant:

bool ReconstructShader<UsdPrimvarReader_int>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    UsdPrimvarReader_int *preader,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options)
{
  (void)spec;
  (void)references;
  (void)options;
  std::set<std::string> table;
  table.insert("info:id"); // `info:id` is already parsed in ReconstructPrim<Shader>
  for (auto &prop : properties) {
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:fallback", UsdPrimvarReader_int,
                   preader->fallback)
    if ((prop.first == kInputsVarname) && !table.count(kInputsVarname)) {
      // Support older spec: `token` for varname
      TypedAttribute<Animatable<value::token>> tok_attr;
      auto ret = ParseTypedAttribute(table, prop.first, prop.second, kInputsVarname, tok_attr);
      if (ret.code == ParseResult::ResultCode::Success) {
        if (!ConvertTokenAttributeToStringAttribute(tok_attr, preader->varname)) {
          PUSH_ERROR_AND_RETURN("Failed to convert inputs:varname token type to string type.");
        }
        continue;
      } else if (ret.code == ParseResult::ResultCode::TypeMismatch) {
        ret = ParseTypedAttribute(table, prop.first, prop.second, "inputs:varname", preader->varname);
        if (ret.code == ParseResult::ResultCode::Success) {
          // ok
          continue;
        } else {
          PUSH_ERROR_AND_RETURN(fmt::format("Faied to parse inputs:varname: {}", ret.err));
        }
      }
    }
    PARSE_SHADER_TERMINAL_ATTRIBUTE(table, prop, "outputs:result",
                                  UsdPrimvarReader_int, preader->result)
    ADD_PROPERTY(table, prop, UsdPrimvarReader_int, preader->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }
  return false;
}